

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lice.cc
# Opt level: O3

void __thiscall P8Lice::P8Lice(P8Lice *this)

{
  string local_78;
  string local_58;
  string local_38;
  
  CouchDBInterface::CouchDBInterface(&this->interface);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"p8portal.phys.washington.edu","");
  CouchDBInterface::setServer(&this->interface,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"5984","");
  CouchDBInterface::setPort(&this->interface,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"p8slowcontrollog","");
  CouchDBInterface::setDBName(&this->interface,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

P8Lice::P8Lice() {
	interface.setServer("p8portal.phys.washington.edu");
	interface.setPort("5984");
	interface.setDBName("p8slowcontrollog");
}